

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::ChainState>::Free(MemoryPool<despot::ChainState> *this,ChainState *obj)

{
  bool bVar1;
  ChainState *local_18;
  ChainState *obj_local;
  MemoryPool<despot::ChainState> *this_local;
  
  local_18 = obj;
  obj_local = (ChainState *)this;
  bVar1 = MemoryObject::IsAllocated((MemoryObject *)&obj->field_0x8);
  if (!bVar1) {
    __assert_fail("obj->IsAllocated()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                  ,0x3b,
                  "void despot::MemoryPool<despot::ChainState>::Free(T *) [T = despot::ChainState]")
    ;
  }
  MemoryObject::ClearAllocated((MemoryObject *)&local_18->field_0x8);
  std::vector<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>::push_back
            (&this->freelist_,&local_18);
  this->num_allocated_ = this->num_allocated_ + -1;
  return;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}